

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O2

void __thiscall
r_comp::Decompiler::decompile_object
          (Decompiler *this,uint16_t object_index,ostringstream *stream,uint64_t time_offset)

{
  SysObject *pSVar1;
  SysObject *pSVar2;
  long lVar3;
  long lVar4;
  SysView *pSVar5;
  byte bVar6;
  ushort uVar7;
  OutStream *pOVar8;
  SysObject **ppSVar9;
  iterator iVar10;
  mapped_type *pmVar11;
  offset_in_Decompiler_to_subr *poVar12;
  SysView **ppSVar13;
  pointer ppSVar14;
  code *pcVar15;
  long *plVar16;
  size_t i;
  uint16_t object_index_local;
  string s;
  
  pOVar8 = this->out_stream;
  object_index_local = object_index;
  if (pOVar8 != (OutStream *)0x0) {
    if (pOVar8->stream == stream) goto LAB_0013b9d0;
    OutStream::~OutStream(pOVar8);
    operator_delete(pOVar8);
  }
  pOVar8 = (OutStream *)operator_new(0x40);
  (pOVar8->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar8->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar8->code_indexes_to_stream_indexes).m_vector.
  super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (pOVar8->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pOVar8->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (pOVar8->positions).m_vector.
  super__Vector_base<std::fpos<__mbstate_t>,_std::allocator<std::fpos<__mbstate_t>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  pOVar8->stream = stream;
  this->out_stream = pOVar8;
LAB_0013b9d0:
  this->time_offset = time_offset;
  std::
  _Hashtable<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->variable_names)._M_h);
  this->last_variable_id = 0;
  ppSVar9 = r_code::vector<r_code::SysObject_*>::operator[]
                      (&(this->image->code_segment).objects,(ulong)object_index);
  pSVar1 = *ppSVar9;
  this->current_object = (ImageObject *)pSVar1;
  this->indents = 0;
  if ((this->partial_decompilation == false) && (this->ignore_named_objects == true)) {
    s._M_dataplus._M_p._0_2_ = *(undefined2 *)(pSVar1 + 0x68);
    iVar10 = std::
             _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->named_objects)._M_h,(key_type *)&s);
    if (iVar10.super__Node_iterator_base<unsigned_short,_false>._M_cur != (__node_type *)0x0) {
      return;
    }
  }
  else {
    ppSVar14 = (this->imported_objects).
               super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl
               .super__Vector_impl_data._M_start;
    do {
      if (ppSVar14 ==
          (this->imported_objects).
          super__Vector_base<r_code::SysObject_*,_std::allocator<r_code::SysObject_*>_>._M_impl.
          super__Vector_impl_data._M_finish) goto LAB_0013ba84;
      pSVar2 = *ppSVar14;
      ppSVar14 = ppSVar14 + 1;
    } while (pSVar1 != pSVar2);
    s._M_dataplus._M_p._0_2_ = *(undefined2 *)(pSVar1 + 0x68);
    iVar10 = std::
             _Hashtable<unsigned_short,_unsigned_short,_std::allocator<unsigned_short>,_std::__detail::_Identity,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
             ::find(&(this->named_objects)._M_h,(key_type *)&s);
    if (iVar10.super__Node_iterator_base<unsigned_short,_false>._M_cur != (__node_type *)0x0) {
      return;
    }
    OutStream::operator<<(this->out_stream,(char (*) [10])"imported\n");
  }
LAB_0013ba84:
  pmVar11 = std::__detail::
            _Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            ::operator[]((_Map_base<unsigned_short,_std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_unsigned_short,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_short>,_std::hash<unsigned_short>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                          *)&this->object_names,&object_index_local);
  std::__cxx11::string::string((string *)&s,(string *)pmVar11);
  std::__cxx11::string::append((char *)&s);
  OutStream::operator<<(this->out_stream,&s);
  this->horizontal_set = false;
  r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(this->current_object + 8),0);
  uVar7 = r_code::Atom::asOpcode();
  poVar12 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                      (&this->renderers,(ulong)uVar7);
  pcVar15 = (code *)*poVar12;
  plVar16 = (long *)((long)&this->out_stream + poVar12[1]);
  if (((ulong)pcVar15 & 1) != 0) {
    pcVar15 = *(code **)(pcVar15 + *plVar16 + -1);
  }
  (*pcVar15)(plVar16,0);
  lVar3 = *(long *)(pSVar1 + 0x58);
  lVar4 = *(long *)(pSVar1 + 0x50);
  if ((lVar3 - lVar4 & 0x7fff8U) == 0) {
    OutStream::operator<<(this->out_stream,(char (*) [5])" |[]");
  }
  else {
    OutStream::operator<<(this->out_stream,(char (*) [4])" []");
    for (i = 0; (ushort)i < (ushort)((uint)(lVar3 - lVar4) >> 3); i = i + 1) {
      write_indent(this,3);
      ppSVar13 = r_code::vector<r_code::SysView_*>::operator[]
                           ((vector<r_code::SysView_*> *)(pSVar1 + 0x50),i);
      pSVar5 = *ppSVar13;
      this->current_object = (ImageObject *)pSVar5;
      r_code::vector<r_code::Atom>::operator[]((vector<r_code::Atom> *)(pSVar5 + 8),0);
      bVar6 = r_code::Atom::getAtomCount();
      write_view(this,0,(ushort)bVar6);
    }
  }
  write_indent(this,0);
  write_indent(this,0);
  std::__cxx11::string::~string((string *)&s);
  return;
}

Assistant:

void Decompiler::decompile_object(uint16_t object_index, std::ostringstream *stream, uint64_t time_offset)
{
    if (!out_stream) {
        out_stream = new OutStream(stream);
    } else if (out_stream->stream != stream) {
        delete out_stream;
        out_stream = new OutStream(stream);
    }

    this->time_offset = time_offset;
    variable_names.clear();
    last_variable_id = 0;
    current_object = image->code_segment.objects[object_index];
    SysObject *sys_object = (SysObject *)current_object;
    uint16_t read_index = 0;
    indents = 0;

    if (!partial_decompilation && ignore_named_objects) { // decompilation of the entire memory.
        if (named_objects.find(sys_object->oid) != named_objects.end()) {
            return;
        }
    } else { // decompiling on-the-fly: ignore named objects only if imported.
        bool imported = false;

        for (SysObject *object : imported_objects) {
            if (sys_object == object) {
                imported = true;
                break;
            }
        }

        if (imported) {
            if (named_objects.find(sys_object->oid) != named_objects.end()) {
                return;
            } else {
                *out_stream << "imported\n";
            }
        } else if (sys_object->oid != UINT32_MAX) {
//            *out_stream << "oid: " << sys_object->oid << "\n";
        }
    }

    std::string s = object_names[object_index];
    s += ":";
    *out_stream << s;
    horizontal_set = false;
    (this->*renderers[current_object->code[read_index].asOpcode()])(read_index);
    uint16_t view_count = sys_object->views.size();

    if (view_count) { // write the set of views
        *out_stream << " []";

        for (uint16_t i = 0; i < view_count; ++i) {
            write_indent(3);
            current_object = sys_object->views[i];
            write_view(0, current_object->code[0].getAtomCount());
        }
    } else {
        *out_stream << " |[]";
    }

    write_indent(0);
    write_indent(0);
}